

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void DumpLiteral(SQObjectPtr *o)

{
  int iVar1;
  SQChar *pSVar2;
  char *pcVar3;
  int *in_RDI;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0x1000008) {
    pcVar3 = "false";
    if (*(long *)(in_RDI + 2) != 0) {
      pcVar3 = "true";
    }
    printf("%s",pcVar3);
  }
  else if (iVar1 == 0x5000002) {
    printf("{%lld}",*(undefined8 *)(in_RDI + 2));
  }
  else if (iVar1 == 0x5000004) {
    printf("{%f}",(double)(float)in_RDI[2]);
  }
  else if (iVar1 == 0x8000010) {
    printf("\"%s\"",*(long *)(in_RDI + 2) + 0x38);
  }
  else {
    pSVar2 = GetTypeName((SQObjectPtr *)0x11d5bc);
    printf("(%s %p)",pSVar2,*(undefined8 *)(in_RDI + 2));
  }
  return;
}

Assistant:

void DumpLiteral(SQObjectPtr &o)
{
    switch(sq_type(o)){
        case OT_STRING: scprintf(_SC("\"%s\""),_stringval(o));break;
        case OT_FLOAT: scprintf(_SC("{%f}"),_float(o));break;
        case OT_INTEGER: scprintf(_SC("{") _PRINT_INT_FMT _SC("}"),_integer(o));break;
        case OT_BOOL: scprintf(_SC("%s"),_integer(o)?_SC("true"):_SC("false"));break;
        default: scprintf(_SC("(%s %p)"),GetTypeName(o),(void*)_rawval(o));break; break; //shut up compiler
    }
}